

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O0

bool node::WriteSnapshotBaseBlockhash(Chainstate *snapshot_chainstate)

{
  long lVar1;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  int iVar3;
  FILE *data_xor;
  FILE *pFVar4;
  long in_FS_OFFSET;
  FILE *file;
  AutoFile afile;
  path write_to;
  optional<fs::path> chaindir;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  CCoinsViewDB *in_stack_fffffffffffffe20;
  Chainstate *in_stack_fffffffffffffe28;
  path *in_stack_fffffffffffffe30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe38;
  FILE *file_00;
  FILE *flag;
  int in_stack_fffffffffffffe8c;
  bool local_159;
  ConstevalFormatString<1U> in_stack_fffffffffffffec8;
  string_view in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffee0;
  char *pcVar5;
  AutoFile local_f8 [3];
  char local_60 [32];
  Level in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe1c,(AnnotatedMixin<std::recursive_mutex> *)0x952bd3);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<uint256> *)
                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (!bVar2) {
    __assert_fail("snapshot_chainstate.m_from_snapshot_blockhash",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
                  ,0x1a,"bool node::WriteSnapshotBaseBlockhash(Chainstate &)");
  }
  Chainstate::CoinsDB(in_stack_fffffffffffffe28);
  CCoinsViewDB::StoragePath(in_stack_fffffffffffffe20);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<fs::path> *)
                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (!bVar2) {
    __assert_fail("chaindir",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
                  ,0x1d,"bool node::WriteSnapshotBaseBlockhash(Chainstate &)");
  }
  std::optional<fs::path>::operator*
            ((optional<fs::path> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (path *)0x952c79);
  fs::operator/(in_stack_fffffffffffffe30,(path *)in_stack_fffffffffffffe28);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  data_xor = fsbridge::fopen(local_60,"wb");
  pcVar5 = (char *)0x0;
  file_00 = (FILE *)&stack0xfffffffffffffee8;
  pFVar4 = data_xor;
  flag = data_xor;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  AutoFile::AutoFile((AutoFile *)pFVar4,file_00,
                     (vector<std::byte,_std::allocator<std::byte>_> *)data_xor);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffe28);
  bVar2 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
                          );
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe18 = 2;
    logging_function._M_str = pcVar5;
    logging_function._M_len = in_stack_fffffffffffffee0;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,in_stack_fffffffffffffed0,in_stack_fffffffffffffe8c,(LogFlags)flag,
               in_stack_ffffffffffffffc0,in_stack_fffffffffffffec8,in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_159 = false;
  }
  else {
    pFVar4 = (FILE *)std::optional<uint256>::operator*
                               ((optional<uint256> *)
                                CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    AutoFile::operator<<((AutoFile *)in_stack_fffffffffffffe28,(uint256 *)in_stack_fffffffffffffe20)
    ;
    iVar3 = AutoFile::fclose(local_f8,pFVar4);
    if (iVar3 == 0) {
      local_159 = true;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe20);
      in_stack_fffffffffffffe18 = 2;
      logging_function_00._M_str = pcVar5;
      logging_function_00._M_len = in_stack_fffffffffffffee0;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,in_stack_fffffffffffffed0,in_stack_fffffffffffffe8c,
                 (LogFlags)flag,in_stack_ffffffffffffffc0,in_stack_fffffffffffffec8,
                 in_stack_ffffffffffffffd0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_159 = false;
    }
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::optional<fs::path>::~optional
            ((optional<fs::path> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_159;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteSnapshotBaseBlockhash(Chainstate& snapshot_chainstate)
{
    AssertLockHeld(::cs_main);
    assert(snapshot_chainstate.m_from_snapshot_blockhash);

    const std::optional<fs::path> chaindir = snapshot_chainstate.CoinsDB().StoragePath();
    assert(chaindir); // Sanity check that chainstate isn't in-memory.
    const fs::path write_to = *chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;

    FILE* file{fsbridge::fopen(write_to, "wb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for writing: %s\n",
                  fs::PathToString(write_to));
        return false;
    }
    afile << *snapshot_chainstate.m_from_snapshot_blockhash;

    if (afile.fclose() != 0) {
        LogPrintf("[snapshot] failed to close base blockhash file %s after writing\n",
                  fs::PathToString(write_to));
        return false;
    }
    return true;
}